

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionCallStatementNode *node)

{
  ostream *poVar1;
  PrintVisitor visitor;
  undefined **local_48;
  ostream *local_40;
  int local_38;
  undefined4 uStack_34;
  
  poVar1 = this->stream_;
  local_48 = (undefined **)&local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)local_48,(long)local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FunctionCallStatementNode:\n",0x1b);
  if (local_48 != (undefined **)&local_38) {
    operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
  }
  local_40 = this->stream_;
  local_38 = this->indentation_ + 1;
  local_48 = &PTR__Visitor_0014fd88;
  (**(code **)((long)(((node->functionCall_)._M_t.
                       super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>
                       .super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl)->super_Node).
                     _vptr_Node + 0x10))();
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionCallStatementNode& node)
{
  stream_ << indent() << "FunctionCallStatementNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getFunctionCall().accept(visitor);
}